

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  uint uVar1;
  vfloat<4> vVar2;
  BVH *bvh;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  undefined8 uVar6;
  ulong uVar7;
  undefined8 uVar8;
  size_t sVar9;
  byte bVar10;
  bool bVar11;
  long lVar12;
  undefined4 uVar13;
  size_t sVar14;
  NodeRef root;
  long lVar15;
  byte bVar16;
  long lVar17;
  byte bVar18;
  byte bVar19;
  uint uVar20;
  NodeRef *pNVar21;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar22;
  byte bVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar47;
  int iVar48;
  int iVar49;
  vint4 ai_2;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar50;
  vint4 bi;
  vint4 bi_1;
  undefined1 in_ZMM2 [64];
  vint4 bi_3;
  vint4 ai;
  vint4 bi_2;
  vint4 ai_1;
  vint4 ai_3;
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar56 [64];
  uint local_363c;
  Precalculations pre;
  TravRayK<4,_false> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar25 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar29 = ZEXT816(0) << 0x40;
    uVar6 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar29,5);
    uVar24 = vpcmpeqd_avx512vl(auVar25,(undefined1  [16])valid_i->field_0);
    uVar24 = ((byte)uVar6 & 0xf) & uVar24;
    bVar23 = (byte)uVar24;
    if (bVar23 != 0) {
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar25 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar52 = ZEXT1664(auVar25);
      auVar26 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar25);
      auVar28._8_4_ = 0x219392ef;
      auVar28._0_8_ = 0x219392ef219392ef;
      auVar28._12_4_ = 0x219392ef;
      uVar7 = vcmpps_avx512vl(auVar26,auVar28,1);
      bVar11 = (bool)((byte)uVar7 & 1);
      auVar26._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * tray.dir.field_0._0_4_;
      bVar11 = (bool)((byte)(uVar7 >> 1) & 1);
      auVar26._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * tray.dir.field_0._4_4_;
      bVar11 = (bool)((byte)(uVar7 >> 2) & 1);
      auVar26._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * tray.dir.field_0._8_4_;
      bVar11 = (bool)((byte)(uVar7 >> 3) & 1);
      auVar26._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * tray.dir.field_0._12_4_;
      auVar27 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar25);
      uVar7 = vcmpps_avx512vl(auVar27,auVar28,1);
      bVar11 = (bool)((byte)uVar7 & 1);
      auVar27._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * tray.dir.field_0._16_4_;
      bVar11 = (bool)((byte)(uVar7 >> 1) & 1);
      auVar27._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * tray.dir.field_0._20_4_;
      bVar11 = (bool)((byte)(uVar7 >> 2) & 1);
      auVar27._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * tray.dir.field_0._24_4_;
      bVar11 = (bool)((byte)(uVar7 >> 3) & 1);
      auVar27._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * tray.dir.field_0._28_4_;
      auVar25 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar25);
      uVar7 = vcmpps_avx512vl(auVar25,auVar28,1);
      bVar11 = (bool)((byte)uVar7 & 1);
      auVar46._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * tray.dir.field_0._32_4_;
      bVar11 = (bool)((byte)(uVar7 >> 1) & 1);
      auVar46._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * tray.dir.field_0._36_4_;
      bVar11 = (bool)((byte)(uVar7 >> 2) & 1);
      auVar46._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * tray.dir.field_0._40_4_;
      bVar11 = (bool)((byte)(uVar7 >> 3) & 1);
      auVar46._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * tray.dir.field_0._44_4_;
      auVar28 = vrcp14ps_avx512vl(auVar26);
      auVar30._8_4_ = 0x3f800000;
      auVar30._0_8_ = 0x3f8000003f800000;
      auVar30._12_4_ = 0x3f800000;
      auVar25 = vfnmadd213ps_fma(auVar26,auVar28,auVar30);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar25,auVar28,auVar28)
      ;
      auVar26 = vrcp14ps_avx512vl(auVar27);
      auVar25 = vfnmadd213ps_fma(auVar27,auVar26,auVar30);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar25,auVar26,auVar26)
      ;
      auVar26 = vrcp14ps_avx512vl(auVar46);
      auVar25 = vfnmadd213ps_fma(auVar46,auVar26,auVar30);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar25,auVar26,auVar26)
      ;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      uVar7 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar29,1);
      auVar25 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar7 >> 1) & 1) * auVar25._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar7 & 1) * auVar25._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar7 >> 2) & 1) * auVar25._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar7 >> 3) & 1) * auVar25._12_4_;
      uVar7 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar29,5);
      auVar25 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar11 = (bool)((byte)uVar7 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar11 * auVar25._0_4_ | (uint)!bVar11 * 0x60;
      bVar11 = (bool)((byte)(uVar7 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar11 * auVar25._4_4_ | (uint)!bVar11 * 0x60;
      bVar11 = (bool)((byte)(uVar7 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar11 * auVar25._8_4_ | (uint)!bVar11 * 0x60;
      bVar11 = (bool)((byte)(uVar7 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar11 * auVar25._12_4_ | (uint)!bVar11 * 0x60;
      uVar7 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar29,5);
      auVar25 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar11 = (bool)((byte)uVar7 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar11 * auVar25._0_4_ | (uint)!bVar11 * 0xa0;
      bVar11 = (bool)((byte)(uVar7 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar11 * auVar25._4_4_ | (uint)!bVar11 * 0xa0;
      bVar11 = (bool)((byte)(uVar7 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar11 * auVar25._8_4_ | (uint)!bVar11 * 0xa0;
      bVar11 = (bool)((byte)(uVar7 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar11 * auVar25._12_4_ | (uint)!bVar11 * 0xa0;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar54 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar25 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar29);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar23 & 1) * auVar25._0_4_ |
           (uint)!(bool)(bVar23 & 1) * stack_near[0].field_0._0_4_;
      bVar11 = (bool)((byte)(uVar24 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar11 * auVar25._4_4_ | (uint)!bVar11 * stack_near[0].field_0._4_4_;
      bVar11 = (bool)((byte)(uVar24 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar11 * auVar25._8_4_ | (uint)!bVar11 * stack_near[0].field_0._8_4_;
      bVar11 = SUB81(uVar24 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar11 * auVar25._12_4_ | (uint)!bVar11 * stack_near[0].field_0._12_4_;
      auVar25 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar53 = ZEXT1664(auVar25);
      auVar29 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar29);
      tray.tfar.field_0.i[0] =
           (uint)(bVar23 & 1) * auVar29._0_4_ | (uint)!(bool)(bVar23 & 1) * auVar25._0_4_;
      bVar11 = (bool)((byte)(uVar24 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar11 * auVar29._4_4_ | (uint)!bVar11 * auVar25._4_4_;
      bVar11 = (bool)((byte)(uVar24 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar11 * auVar29._8_4_ | (uint)!bVar11 * auVar25._8_4_;
      bVar11 = SUB81(uVar24 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar11 * auVar29._12_4_ | (uint)!bVar11 * auVar25._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar20 = 3;
      }
      else {
        uVar20 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_363c = (ushort)uVar24 ^ 0xf;
      pNVar21 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar22 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar25 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar55 = ZEXT1664(auVar25);
      auVar25 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
      auVar56 = ZEXT1664(auVar25);
LAB_01d6e320:
      do {
        auVar25 = auVar53._0_16_;
        do {
          root.ptr = pNVar21[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01d6e8a5;
          pNVar21 = pNVar21 + -1;
          vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar22[-1].v;
          auVar51 = ZEXT1664((undefined1  [16])vVar2.field_0);
          paVar22 = paVar22 + -1;
          uVar24 = vcmpps_avx512vl((undefined1  [16])vVar2.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar24 == '\0');
        uVar13 = (undefined4)uVar24;
        if (uVar20 < (uint)POPCOUNT(uVar13)) {
LAB_01d6e366:
          do {
            auVar25 = auVar53._0_16_;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01d6e8a5;
              uVar6 = vcmpps_avx512vl((undefined1  [16])tray.tfar.field_0,auVar51._0_16_,6);
              if ((char)uVar6 == '\0') goto LAB_01d6e320;
              bVar10 = ~(byte)local_363c & 0xf;
              auVar29 = *(undefined1 (*) [16])(ray + 0x50);
              auVar26 = *(undefined1 (*) [16])(ray + 0x60);
              auVar27 = *(undefined1 (*) [16])(ray + 0x40);
              lVar15 = (root.ptr & 0xfffffffffffffff0) + 0x90;
              lVar12 = 0;
              goto LAB_01d6e55c;
            }
            sVar14 = 8;
            aVar50 = auVar54._0_16_;
            for (lVar12 = 0;
                (auVar51 = ZEXT1664((undefined1  [16])aVar50), lVar12 != 8 &&
                (sVar3 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar12 * 8), sVar3 != 8));
                lVar12 = lVar12 + 1) {
              uVar13 = *(undefined4 *)(root.ptr + 0x40 + lVar12 * 4);
              auVar41._4_4_ = uVar13;
              auVar41._0_4_ = uVar13;
              auVar41._8_4_ = uVar13;
              auVar41._12_4_ = uVar13;
              auVar26 = vfmsub132ps_fma(auVar41,(undefined1  [16])
                                                tray.org_rdir.field_0.field_0.x.field_0,
                                        (undefined1  [16])tray.rdir.field_0.field_0.x.field_0);
              auVar37._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar37._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar37._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar37._12_4_ = tray.org_rdir.field_0._28_4_;
              uVar13 = *(undefined4 *)(root.ptr + 0x80 + lVar12 * 4);
              auVar42._4_4_ = uVar13;
              auVar42._0_4_ = uVar13;
              auVar42._8_4_ = uVar13;
              auVar42._12_4_ = uVar13;
              auVar38._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar38._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar38._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar38._12_4_ = tray.org_rdir.field_0._44_4_;
              uVar13 = *(undefined4 *)(root.ptr + 0xc0 + lVar12 * 4);
              auVar43._4_4_ = uVar13;
              auVar43._0_4_ = uVar13;
              auVar43._8_4_ = uVar13;
              auVar43._12_4_ = uVar13;
              auVar27 = vfmsub132ps_fma(auVar42,auVar37,
                                        (undefined1  [16])tray.rdir.field_0.field_0.y.field_0);
              auVar46 = vfmsub132ps_fma(auVar43,auVar38,
                                        (undefined1  [16])tray.rdir.field_0.field_0.z.field_0);
              uVar13 = *(undefined4 *)(root.ptr + 0x60 + lVar12 * 4);
              auVar25._4_4_ = uVar13;
              auVar25._0_4_ = uVar13;
              auVar25._8_4_ = uVar13;
              auVar25._12_4_ = uVar13;
              auVar28 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,
                                   (undefined1  [16])tray.org_rdir.field_0.field_0.x.field_0,auVar25
                                  );
              uVar13 = *(undefined4 *)(root.ptr + 0xa0 + lVar12 * 4);
              auVar29._4_4_ = uVar13;
              auVar29._0_4_ = uVar13;
              auVar29._8_4_ = uVar13;
              auVar29._12_4_ = uVar13;
              auVar30 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar37,
                                   auVar29);
              uVar13 = *(undefined4 *)(root.ptr + 0xe0 + lVar12 * 4);
              auVar36._4_4_ = uVar13;
              auVar36._0_4_ = uVar13;
              auVar36._8_4_ = uVar13;
              auVar36._12_4_ = uVar13;
              auVar31 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar38,
                                   auVar36);
              auVar25 = vpminsd_avx(auVar26,auVar28);
              auVar29 = vpminsd_avx(auVar27,auVar30);
              auVar25 = vpmaxsd_avx(auVar25,auVar29);
              auVar29 = vpminsd_avx(auVar46,auVar31);
              auVar25 = vpmaxsd_avx(auVar25,auVar29);
              auVar29 = vpmaxsd_avx(auVar26,auVar28);
              auVar26 = vpmaxsd_avx(auVar27,auVar30);
              auVar26 = vpminsd_avx(auVar29,auVar26);
              auVar29 = vpmaxsd_avx(auVar46,auVar31);
              auVar26 = vpminsd_avx(auVar26,auVar29);
              auVar29 = vpmaxsd_avx(auVar25,(undefined1  [16])tray.tnear.field_0);
              auVar26 = vpminsd_avx(auVar26,(undefined1  [16])tray.tfar.field_0);
              uVar24 = vpcmpd_avx512vl(auVar29,auVar26,2);
              uVar24 = uVar24 & 0xf;
              sVar9 = sVar14;
              aVar32 = aVar50;
              if ((byte)uVar24 != 0) {
                auVar29 = vblendmps_avx512vl((undefined1  [16])auVar54._0_16_,auVar25);
                bVar11 = (bool)((byte)uVar24 & 1);
                aVar32._0_4_ = (uint)bVar11 * auVar29._0_4_ | (uint)!bVar11 * auVar25._0_4_;
                bVar11 = (bool)((byte)(uVar24 >> 1) & 1);
                aVar32._4_4_ = (uint)bVar11 * auVar29._4_4_ | (uint)!bVar11 * auVar25._4_4_;
                bVar11 = (bool)((byte)(uVar24 >> 2) & 1);
                aVar32._8_4_ = (uint)bVar11 * auVar29._8_4_ | (uint)!bVar11 * auVar25._8_4_;
                bVar11 = SUB81(uVar24 >> 3,0);
                aVar32._12_4_ = (uint)bVar11 * auVar29._12_4_ | (uint)!bVar11 * auVar25._12_4_;
                sVar9 = sVar3;
                if (sVar14 != 8) {
                  pNVar21->ptr = sVar14;
                  pNVar21 = pNVar21 + 1;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar22->v = aVar50;
                  paVar22 = paVar22 + 1;
                }
              }
              aVar50 = aVar32;
              sVar14 = sVar9;
            }
            if (sVar14 == 8) goto LAB_01d6e4ce;
            uVar6 = vcmpps_avx512vl((undefined1  [16])aVar50,(undefined1  [16])tray.tfar.field_0,9);
            root.ptr = sVar14;
          } while ((byte)uVar20 < (byte)POPCOUNT((int)uVar6));
          pNVar21->ptr = sVar14;
          pNVar21 = pNVar21 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar22->v = aVar50;
          paVar22 = paVar22 + 1;
LAB_01d6e4ce:
          iVar47 = 4;
        }
        else {
          while (uVar24 != 0) {
            sVar14 = 0;
            for (uVar7 = uVar24; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x8000000000000000) {
              sVar14 = sVar14 + 1;
            }
            uVar24 = uVar24 - 1 & uVar24;
            bVar11 = occluded1(This,bvh,root,sVar14,&pre,ray,&tray,context);
            bVar10 = (byte)(1 << ((uint)sVar14 & 0x1f));
            if (!bVar11) {
              bVar10 = 0;
            }
            local_363c = (uint)((byte)local_363c | bVar10);
          }
          iVar47 = 3;
          auVar25 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar52 = ZEXT1664(auVar25);
          auVar25 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
          auVar53 = ZEXT1664(auVar25);
          auVar25 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar54 = ZEXT1664(auVar25);
          auVar25 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar55 = ZEXT1664(auVar25);
          auVar25 = vxorps_avx512vl(auVar56._0_16_,auVar56._0_16_);
          auVar56 = ZEXT1664(auVar25);
          auVar51 = ZEXT1664((undefined1  [16])vVar2.field_0);
          if ((byte)local_363c != 0xf) {
            auVar25 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)((byte)local_363c & 1) * auVar25._0_4_ |
                 (uint)!(bool)((byte)local_363c & 1) * tray.tfar.field_0.i[0];
            bVar11 = (bool)((byte)(local_363c >> 1) & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar11 * auVar25._4_4_ | (uint)!bVar11 * tray.tfar.field_0.i[1];
            bVar11 = (bool)((byte)(local_363c >> 2) & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar11 * auVar25._8_4_ | (uint)!bVar11 * tray.tfar.field_0.i[2];
            bVar11 = (bool)((byte)(local_363c >> 3) & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar11 * auVar25._12_4_ | (uint)!bVar11 * tray.tfar.field_0.i[3];
            iVar47 = 2;
          }
          if (uVar20 < (uint)POPCOUNT(uVar13)) goto LAB_01d6e366;
        }
        auVar25 = auVar53._0_16_;
      } while (iVar47 != 3);
LAB_01d6e8a5:
      local_363c._0_1_ = (byte)local_363c & bVar23;
      bVar11 = (bool)((byte)local_363c >> 1 & 1);
      bVar4 = (bool)((byte)local_363c >> 2 & 1);
      *(uint *)(ray + 0x80) =
           (uint)((byte)local_363c & 1) * auVar25._0_4_ |
           (uint)!(bool)((byte)local_363c & 1) * *(int *)(ray + 0x80);
      *(uint *)(ray + 0x84) = (uint)bVar11 * auVar25._4_4_ | (uint)!bVar11 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar4 * auVar25._8_4_ | (uint)!bVar4 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)((byte)local_363c >> 3) * auVar25._12_4_ |
           (uint)!(bool)((byte)local_363c >> 3) * *(int *)(ray + 0x8c);
    }
  }
  return;
LAB_01d6e55c:
  do {
    if (lVar12 == (ulong)((uint)root.ptr & 0xf) - 8) goto LAB_01d6e77c;
    lVar17 = -0x10;
    bVar16 = bVar10;
    do {
      if ((lVar17 == 0) || (uVar24 = (ulong)*(uint *)(lVar15 + 0x10 + lVar17), uVar24 == 0xffffffff)
         ) goto LAB_01d6e767;
      uVar13 = *(undefined4 *)(lVar15 + -0x80 + lVar17);
      auVar31._4_4_ = uVar13;
      auVar31._0_4_ = uVar13;
      auVar31._8_4_ = uVar13;
      auVar31._12_4_ = uVar13;
      auVar46 = vsubps_avx(auVar31,*(undefined1 (*) [16])ray);
      uVar13 = *(undefined4 *)(lVar15 + -0x70 + lVar17);
      auVar33._4_4_ = uVar13;
      auVar33._0_4_ = uVar13;
      auVar33._8_4_ = uVar13;
      auVar33._12_4_ = uVar13;
      auVar28 = vsubps_avx(auVar33,*(undefined1 (*) [16])(ray + 0x10));
      uVar13 = *(undefined4 *)(lVar15 + -0x60 + lVar17);
      auVar34._4_4_ = uVar13;
      auVar34._0_4_ = uVar13;
      auVar34._8_4_ = uVar13;
      auVar34._12_4_ = uVar13;
      auVar30 = vsubps_avx(auVar34,*(undefined1 (*) [16])(ray + 0x20));
      auVar33 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar15 + -0x50 + lVar17)));
      auVar34 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar15 + -0x40 + lVar17)));
      auVar35 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar15 + -0x30 + lVar17)));
      auVar36 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar15 + -0x20 + lVar17)));
      auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar15 + -0x10 + lVar17)));
      auVar38 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar15 + lVar17)));
      auVar31 = vmulss_avx512f(auVar34,auVar38);
      auVar39._0_4_ = auVar31._0_4_;
      auVar39._4_4_ = auVar39._0_4_;
      auVar39._8_4_ = auVar39._0_4_;
      auVar39._12_4_ = auVar39._0_4_;
      auVar39 = vfmsub231ps_avx512vl(auVar39,auVar37,auVar35);
      auVar31 = vmulss_avx512f(auVar35,auVar36);
      auVar40._0_4_ = auVar31._0_4_;
      auVar40._4_4_ = auVar40._0_4_;
      auVar40._8_4_ = auVar40._0_4_;
      auVar40._12_4_ = auVar40._0_4_;
      auVar40 = vfmsub231ps_avx512vl(auVar40,auVar38,auVar33);
      auVar31 = vmulss_avx512f(auVar33,auVar37);
      auVar31 = vbroadcastss_avx512vl(auVar31);
      auVar41 = vfmsub231ps_avx512vl(auVar31,auVar36,auVar34);
      auVar31 = vmulps_avx512vl(auVar29,auVar30);
      auVar42 = vfmsub231ps_avx512vl(auVar31,auVar28,auVar26);
      auVar31 = vmulps_avx512vl(auVar26,auVar46);
      auVar43 = vfmsub231ps_avx512vl(auVar31,auVar30,auVar27);
      auVar31 = vmulps_avx512vl(auVar27,auVar28);
      auVar44 = vfmsub231ps_avx512vl(auVar31,auVar46,auVar29);
      auVar31 = vmulps_avx512vl(auVar41,auVar26);
      auVar31 = vfmadd231ps_fma(auVar31,auVar40,auVar29);
      auVar31 = vfmadd231ps_fma(auVar31,auVar39,auVar27);
      auVar45 = vandps_avx512vl(auVar31,auVar55._0_16_);
      auVar38 = vmulps_avx512vl(auVar38,auVar44);
      auVar37 = vfmadd231ps_avx512vl(auVar38,auVar43,auVar37);
      auVar36 = vfmadd231ps_avx512vl(auVar37,auVar42,auVar36);
      auVar36 = vxorps_avx512vl(auVar45,auVar36);
      auVar37 = auVar56._0_16_;
      uVar6 = vcmpps_avx512vl(auVar36,auVar37,5);
      bVar18 = 0;
      bVar19 = (byte)uVar6 & bVar16;
      if (bVar19 != 0) {
        auVar35 = vmulps_avx512vl(auVar35,auVar44);
        auVar34 = vfmadd213ps_avx512vl(auVar43,auVar34,auVar35);
        auVar33 = vfmadd213ps_avx512vl(auVar42,auVar33,auVar34);
        auVar33 = vxorps_avx512vl(auVar45,auVar33);
        uVar6 = vcmpps_avx512vl(auVar33,auVar37,5);
        bVar19 = bVar19 & (byte)uVar6;
        if (bVar19 != 0) {
          auVar34 = vandps_avx512vl(auVar31,auVar52._0_16_);
          auVar35 = vsubps_avx512vl(auVar34,auVar36);
          uVar6 = vcmpps_avx512vl(auVar35,auVar33,5);
          bVar19 = bVar19 & (byte)uVar6;
          if (bVar19 != 0) {
            auVar30 = vmulps_avx512vl(auVar41,auVar30);
            auVar28 = vfmadd213ps_fma(auVar28,auVar40,auVar30);
            auVar46 = vfmadd213ps_fma(auVar46,auVar39,auVar28);
            auVar46 = vxorps_avx512vl(auVar45,auVar46);
            auVar28 = vmulps_avx512vl(auVar34,*(undefined1 (*) [16])(ray + 0x30));
            auVar30 = vmulps_avx512vl(auVar34,*(undefined1 (*) [16])(ray + 0x80));
            uVar6 = vcmpps_avx512vl(auVar46,auVar30,2);
            uVar8 = vcmpps_avx512vl(auVar28,auVar46,1);
            bVar19 = bVar19 & (byte)uVar6 & (byte)uVar8;
            if (bVar19 == 0) {
              bVar18 = 0;
              auVar46 = vxorps_avx512vl(auVar37,auVar37);
              auVar56 = ZEXT1664(auVar46);
            }
            else {
              auVar46 = vxorps_avx512vl(auVar37,auVar37);
              auVar56 = ZEXT1664(auVar46);
              uVar6 = vcmpps_avx512vl(auVar31,auVar46,4);
              bVar18 = bVar19 & (byte)uVar6;
            }
            goto LAB_01d6e674;
          }
        }
        bVar18 = 0;
      }
LAB_01d6e674:
      uVar1 = ((context->scene->geometries).items[uVar24].ptr)->mask;
      auVar35._4_4_ = uVar1;
      auVar35._0_4_ = uVar1;
      auVar35._8_4_ = uVar1;
      auVar35._12_4_ = uVar1;
      uVar6 = vptestmd_avx512vl(*(undefined1 (*) [16])(ray + 0x90),auVar35);
      bVar18 = (byte)uVar6 & 0xf & bVar18;
      lVar17 = lVar17 + 4;
      bVar16 = bVar16 & (-(bVar18 == 0) | bVar18 ^ 0xf);
    } while (bVar16 != 0);
    bVar16 = 0;
LAB_01d6e767:
    lVar12 = lVar12 + 1;
    lVar15 = lVar15 + 0xb0;
    bVar10 = bVar10 & bVar16;
  } while (bVar10 != 0);
  bVar10 = 0;
LAB_01d6e77c:
  bVar10 = (byte)local_363c | ~bVar10 & 0xf;
  local_363c = (uint)bVar10;
  if (bVar10 == 0xf) {
    local_363c._0_1_ = 0xf;
    goto LAB_01d6e8a5;
  }
  auVar25 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  iVar47 = tray.tfar.field_0._0_4_;
  bVar11 = (bool)(bVar10 >> 1 & 1);
  bVar4 = (bool)(bVar10 >> 2 & 1);
  iVar48 = tray.tfar.field_0._8_4_;
  bVar5 = (bool)(bVar10 >> 3 & 1);
  iVar49 = tray.tfar.field_0._12_4_;
  tray.tfar.field_0.i[1] = (uint)bVar11 * auVar25._4_4_ | (uint)!bVar11 * tray.tfar.field_0._4_4_;
  tray.tfar.field_0.i[0] = (uint)(bVar10 & 1) * auVar25._0_4_ | (uint)!(bool)(bVar10 & 1) * iVar47;
  tray.tfar.field_0.i[2] = (uint)bVar4 * auVar25._8_4_ | (uint)!bVar4 * iVar48;
  tray.tfar.field_0.i[3] = (uint)bVar5 * auVar25._12_4_ | (uint)!bVar5 * iVar49;
  goto LAB_01d6e320;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }